

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

char * absl::lts_20240722::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char sym [200];
  char local_f8 [200];
  
  if (0 < maxlen && n != 0) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      if (symbolize) {
        cVar1 = absl::lts_20240722::Symbolize(pcs[lVar4],local_f8,200);
        if (cVar1 == '\0') {
          local_f8[0] = '\0';
        }
        pcVar3 = "";
        if (lVar4 == 0) {
          pcVar3 = "\n";
        }
        snprintf(buf + iVar5,(long)(maxlen - iVar5),"%s\t@ %p %s\n",pcVar3,pcs[lVar4],local_f8);
      }
      else {
        snprintf(buf + iVar5,(long)(maxlen - iVar5)," %p",pcs[lVar4]);
      }
      sVar2 = strlen(buf + iVar5);
      if ((ulong)(uint)n - 1 == lVar4) {
        return buf;
      }
      iVar5 = iVar5 + (int)sVar2;
      lVar4 = lVar4 + 1;
    } while (iVar5 < maxlen);
  }
  return buf;
}

Assistant:

static char* StackString(void** pcs, int n, char* buf, int maxlen,
                         bool symbolize) {
  static constexpr int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (len >= maxlen)
      return buf;
    size_t count = static_cast<size_t>(maxlen - len);
    if (symbolize) {
      if (!absl::Symbolize(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, count, "%s\t@ %p %s\n", (i == 0 ? "\n" : ""), pcs[i],
               sym);
    } else {
      snprintf(buf + len, count, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}